

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void licm_add_loop_preheaders(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  in_edge_t_conflict peVar1;
  bb_insn_t pbVar2;
  bb_insn_t pbVar3;
  loop_node_t plVar4;
  bb_t pbVar5;
  DLIST_in_edge_t *pDVar6;
  bb_t_conflict bb;
  loop_node_t_conflict plVar7;
  int iVar8;
  loop_node_t_conflict after;
  DLIST_loop_node_t *pDVar9;
  edge_t_conflict e;
  bool bVar10;
  
  bVar10 = false;
  pDVar9 = &loop->children;
  while (plVar7 = pDVar9->head, plVar7 != (loop_node_t_conflict)0x0) {
    if (plVar7->bb == (bb_t)0x0) {
      licm_add_loop_preheaders(gen_ctx,plVar7);
      bVar10 = true;
    }
    pDVar9 = (DLIST_loop_node_t *)&(plVar7->children_link).next;
  }
  if (bVar10) {
    return;
  }
  if (gen_ctx->curr_cfg->root_loop_node == loop) {
    return;
  }
  (loop->u).preheader = (loop_node_t)0x0;
  e = (edge_t_conflict)0x0;
  pDVar6 = &loop->entry->bb->in_edges;
  while (peVar1 = pDVar6->head, peVar1 != (in_edge_t_conflict)0x0) {
    if ((peVar1->back_edge_p == '\0') && (bVar10 = e != (edge_t_conflict)0x0, e = peVar1, bVar10)) {
      return;
    }
    pDVar6 = (DLIST_in_edge_t *)&(peVar1->in_link).next;
  }
  if (e == (edge_t_conflict)0x0) {
    return;
  }
  pbVar2 = (e->src->bb_insns).tail;
  pbVar3 = (e->dst->bb_insns).head;
  if (pbVar3 == (bb_insn_t)0x0 || pbVar2 == (bb_insn_t)0x0) {
    if (pbVar2 == (bb_insn_t)0x0) goto LAB_0013f622;
  }
  else if ((pbVar2->insn->insn_link).next != pbVar3->insn) {
    return;
  }
  iVar8 = (int)*(undefined8 *)&pbVar2->insn->field_0x18;
  if ((iVar8 == 0x76) || (((iVar8 - 0xa5U < 0xffffffd1 && (iVar8 != 0xa6)) && (iVar8 != 0xaa)))) {
LAB_0013f622:
    loop->u = (anon_union_8_2_35464522_for_u)e->src->loop_node;
    (e->src->loop_node->u).preheader = loop;
    return;
  }
  bb = create_bb(gen_ctx,(MIR_insn_t)0x0);
  plVar7 = create_loop_node(gen_ctx,bb);
  plVar4 = loop->parent;
  add_new_bb(gen_ctx,bb);
  DLIST_bb_t_remove(&gen_ctx->curr_cfg->bbs,bb);
  DLIST_bb_t_insert_before(&gen_ctx->curr_cfg->bbs,e->dst,bb);
  if (plVar4 == (loop_node_t)0x0) {
    __assert_fail("parent != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x147d,"void create_preheader_from_edge(gen_ctx_t, edge_t, loop_node_t)");
  }
  pbVar5 = (e->dst->bb_link).prev;
  if ((pbVar5 == (bb_t)0x0) || (after = pbVar5->loop_node, after->parent != plVar4)) {
    after = e->src->loop_node;
    if (after->parent != plVar4) {
      DLIST_loop_node_t_append(&plVar4->children,plVar7);
      goto LAB_0013f6fc;
    }
  }
  DLIST_loop_node_t_insert_after(&plVar4->children,after,plVar7);
LAB_0013f6fc:
  plVar7->parent = plVar4;
  (plVar7->u).preheader = loop;
  (loop->u).preheader = plVar7;
  create_edge(gen_ctx,e->src,bb,1,0);
  create_edge(gen_ctx,bb,e->dst,1,0);
  delete_edge(e);
  return;
}

Assistant:

static void licm_add_loop_preheaders (gen_ctx_t gen_ctx, loop_node_t loop) {
  int subloop_p = FALSE;
  bb_insn_t bb_insn;
  edge_t e;

  for (loop_node_t node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      licm_add_loop_preheaders (gen_ctx, node); /* process sub-loops */
    }
  /* See loop_licm where we process only the nested loops: */
  if (subloop_p || loop == curr_cfg->root_loop_node) return;
  loop->u.preheader = NULL;
  if ((e = find_loop_entry_edge (loop->entry->bb)) == NULL) return;
  if ((bb_insn = DLIST_TAIL (bb_insn_t, e->src->bb_insns)) == NULL || bb_insn->insn->code == MIR_JMP
      || !MIR_any_branch_code_p (bb_insn->insn->code)) {
    loop->u.preheader = e->src->loop_node;      /* The preheader already exists */
    e->src->loop_node->u.preheader_loop = loop; /* The preheader already exists */
  } else {
    create_preheader_from_edge (gen_ctx, e, loop);
  }
}